

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Map.cpp
# Opt level: O0

void __thiscall Map::Map(Map *this,size_t columnNumber,size_t rowNumber)

{
  size_type __n;
  size_t __n_00;
  allocator<std::shared_ptr<CellType>_> local_49;
  shared_ptr<CellType> local_48;
  vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_> local_38;
  size_type local_20;
  size_t rowNumber_local;
  size_t columnNumber_local;
  Map *this_local;
  
  local_20 = rowNumber;
  rowNumber_local = columnNumber;
  columnNumber_local = (size_t)this;
  std::
  vector<std::vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>,_std::allocator<std::vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>_>_>
  ::vector(&this->map);
  __n_00 = rowNumber_local;
  __n = local_20;
  std::shared_ptr<CellType>::shared_ptr(&local_48,(nullptr_t)0x0);
  std::allocator<std::shared_ptr<CellType>_>::allocator(&local_49);
  std::vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>::vector
            (&local_38,__n,&local_48,&local_49);
  std::
  vector<std::vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>,_std::allocator<std::vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>_>_>
  ::assign(&this->map,__n_00,&local_38);
  std::vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>::~vector
            (&local_38);
  std::allocator<std::shared_ptr<CellType>_>::~allocator(&local_49);
  std::shared_ptr<CellType>::~shared_ptr(&local_48);
  return;
}

Assistant:

Map::Map(size_t columnNumber, size_t rowNumber) {
  map.assign(columnNumber, std::vector<std::shared_ptr<CellType> >(rowNumber, nullptr));
}